

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::PixelStatsAccumulator::ReportPixelMS(PixelStatsAccumulator *this,Point2i *p,float ms)

{
  Tuple2<pbrt::Point2,_int> resolution;
  Allocator alloc;
  Point2i p_00;
  PixelStats *this_00;
  Float FVar1;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator<char> local_f5;
  float local_f4;
  WrapMode2D local_f0;
  ColorEncodingHandle local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Image local_c0;
  
  local_f4 = ms;
  resolution = (Tuple2<pbrt::Point2,_int>)Bounds2<int>::Diagonal((Bounds2<int> *)imageBounds);
  this_00 = this->stats;
  if ((this_00->time).resolution.super_Tuple2<pbrt::Point2,_int> != resolution) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"ms",&local_f5);
    local_e8.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = &local_e0;
    Image::Image(&local_c0,Float,(Point2i)resolution,channels,&local_e8,alloc);
    Image::operator=(&this->stats->time,&local_c0);
    Image::~Image(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = this->stats;
  }
  p_00.super_Tuple2<pbrt::Point2,_int>.x =
       (p->super_Tuple2<pbrt::Point2,_int>).x - imageBounds._0_4_;
  p_00.super_Tuple2<pbrt::Point2,_int>.y =
       (p->super_Tuple2<pbrt::Point2,_int>).y - imageBounds._4_4_;
  WrapMode2D::WrapMode2D(&local_f0,Clamp);
  FVar1 = Image::GetChannel(&this_00->time,p_00,0,local_f0);
  Image::SetChannel(&this_00->time,p_00,0,FVar1 + local_f4);
  return;
}

Assistant:

void PixelStatsAccumulator::ReportPixelMS(const Point2i &p, float ms) {
    Point2i res = Point2i(imageBounds.Diagonal());
    if (stats->time.Resolution() != res)
        stats->time = Image(PixelFormat::Float, res, {"ms"});

    Point2i pp = Point2i(p - imageBounds.pMin);
    stats->time.SetChannel(pp, 0, stats->time.GetChannel(pp, 0) + ms);
}